

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::remove_excludes(App *this,App *app)

{
  App *pAVar1;
  bool bVar2;
  byte bVar3;
  const_iterator __position;
  byte unaff_R12B;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  bVar2 = false;
  while( true ) {
    p_Var4 = &(this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header;
    for (__position._M_node =
              (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)__position._M_node != p_Var4 &&
        (*(App **)(__position._M_node + 1) != app));
        __position._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node)) {
    }
    bVar5 = (_Rb_tree_header *)__position._M_node == p_Var4;
    if (bVar5) break;
    pAVar1 = *(App **)(__position._M_node + 1);
    ::std::
    _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
    ::erase_abi_cxx11_((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                        *)&this->exclude_subcommands_,__position);
    bVar3 = !bVar5;
    if (bVar2) {
      bVar3 = unaff_R12B;
    }
    bVar2 = true;
    app = this;
    this = pAVar1;
    unaff_R12B = bVar3;
  }
  bVar3 = !bVar5;
  if (bVar2) {
    bVar3 = unaff_R12B;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

CLI11_INLINE bool App::remove_excludes(App *app) {
    auto iterator = std::find(std::begin(exclude_subcommands_), std::end(exclude_subcommands_), app);
    if(iterator == std::end(exclude_subcommands_)) {
        return false;
    }
    auto *other_app = *iterator;
    exclude_subcommands_.erase(iterator);
    other_app->remove_excludes(this);
    return true;
}